

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParsingTools.hpp
# Opt level: O3

string * __thiscall
Diligent::Parsing::GetContext<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
          (string *__return_storage_ptr__,Parsing *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *Start,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *End,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          Pos,size_t NumLines)

{
  char cVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var2;
  byte bVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  Pos_1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var9;
  string msg;
  stringstream Ctx;
  string local_1f8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d8;
  Parsing *local_1d0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  p_Var4 = *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             **)this;
  p_Var2 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)Start->_M_current;
  if (p_Var4 == p_Var2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    lVar7 = 0;
    do {
      lVar6 = lVar7;
      p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)((long)&End->_M_current + lVar6);
      if ((p_Var8 <= p_Var4) || (cVar1 = *(char *)((long)End + lVar6 + -1), cVar1 == '\r')) break;
      lVar7 = lVar6 + -1;
    } while (cVar1 != '\n');
    p_Var9 = End;
    if (p_Var2 != End) {
      p_Var4 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)0x2401;
      do {
        if ((*(byte *)&End->_M_current < 0xe) &&
           (p_Var9 = End, (0x2401U >> (*(byte *)&End->_M_current & 0x1f) & 1) != 0)) break;
        End = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&End->_M_current + 1);
        p_Var9 = p_Var2;
      } while (End != p_Var2);
    }
    local_1c8 = Start;
    std::__cxx11::stringstream::stringstream(local_1b8);
    p_Var2 = *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               **)this;
    p_Var4 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT71((int7)((ulong)p_Var4 >> 8),Pos._M_current != (char *)0x0);
    local_1c0 = __return_storage_ptr__;
    if (p_Var2 < p_Var8 && Pos._M_current != (char *)0x0) {
      pcVar5 = (char *)0x0;
      local_1d0 = this;
      do {
        local_1d8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&p_Var8[-1]._M_current + 7);
        bVar3 = *(byte *)((long)&p_Var8[-1]._M_current + 7);
        if ((bVar3 != 10) && (bVar3 != 0xd)) {
          FormatString<char[26],char[24]>
                    (&local_1f8,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x82bb50,
                     (char (*) [24])(ulong)bVar3);
          DebugAssertionFailed
                    ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                      local_1f8._M_dataplus._M_p._0_1_),"GetContext",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                     ,0x212);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
              &local_1f8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                     local_1f8._M_dataplus._M_p._0_1_),
                            local_1f8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = *(byte *)&local_1d8->_M_current;
          p_Var2 = *(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     **)local_1d0;
        }
        if (((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&p_Var2->_M_current + 1U) < p_Var8 && bVar3 == 10) &&
           (*(char *)((long)&p_Var8[-1]._M_current + 6) == '\r')) {
          p_Var8 = local_1d8;
        }
        p_Var4 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)p_Var8 - (ulong)(p_Var2 < p_Var8));
        do {
          p_Var8 = p_Var4;
          p_Var4 = p_Var8;
          if (p_Var8 <= p_Var2) goto LAB_003d2a5b;
          cVar1 = *(char *)((long)&p_Var8[-1]._M_current + 7);
        } while ((cVar1 != '\r') &&
                (p_Var4 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&p_Var8[-1]._M_current + 7), cVar1 != '\n'));
        pcVar5 = pcVar5 + 1;
      } while ((pcVar5 < Pos._M_current) && (p_Var2 < p_Var8));
    }
LAB_003d2a5b:
    __return_storage_ptr__ = local_1c0;
    if (((p_Var8 != p_Var2) && (cVar1 = *(char *)((long)&p_Var8[-1]._M_current + 7), cVar1 != '\n'))
       && (cVar1 != '\r')) {
      FormatString<char[26],char[45]>
                (&local_1f8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"CtxStart == Start || IsNewLine(CtxStart[-1])",(char (*) [45])p_Var4
                );
      DebugAssertionFailed
                ((Char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_)
                 ,"GetContext",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ParsingTools.hpp"
                 ,0x21b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
          &local_1f8.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_),
                        local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    std::ostream::write((char *)local_1a8,(long)p_Var8);
    cVar1 = (char)(ostream *)local_1a8;
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    if (lVar6 != 0) {
      lVar7 = -lVar6 + (ulong)(-lVar6 == 0);
      do {
        local_1f8._M_dataplus._M_p._0_1_ = 0x20;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_1f8,1);
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
    local_1f8._M_dataplus._M_p._0_1_ = 0x5e;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1f8,1);
    p_Var4 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_1c8->_M_current;
    if (p_Var9 != p_Var4) {
      if (Pos._M_current != (char *)0x0) {
        pcVar5 = (char *)0x0;
        p_Var2 = p_Var9;
        do {
          if (*(char *)&p_Var2->_M_current == '\r') {
            p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&p_Var2->_M_current + 1);
            if ((p_Var8 != p_Var4) && (*(char *)((long)&p_Var2->_M_current + 1) == '\n')) {
              p_Var2 = p_Var8;
            }
          }
          else if (*(char *)&p_Var2->_M_current == '\0') break;
          p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)((long)&p_Var2->_M_current + (ulong)(p_Var2 != p_Var4));
          p_Var2 = p_Var8;
          while ((p_Var4 != p_Var8 &&
                 ((0xd < *(byte *)&p_Var8->_M_current ||
                  (p_Var2 = p_Var8, (0x2401U >> (*(byte *)&p_Var8->_M_current & 0x1f) & 1) == 0)))))
          {
            p_Var8 = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&p_Var8->_M_current + 1);
            p_Var2 = p_Var4;
          }
          pcVar5 = pcVar5 + 1;
          if ((Pos._M_current <= pcVar5) || (p_Var2 == p_Var4)) break;
        } while( true );
      }
      std::ostream::write((char *)local_1a8,(long)p_Var9);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetContext(const IteratorType& Start, const IteratorType& End, IteratorType Pos, size_t NumLines) noexcept
{
    if (Start == End)
        return "";

    auto CtxStart = Pos;
    while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
        --CtxStart;
    const size_t CharPos = Pos - CtxStart; // Position of the character in the line

    Pos = SkipLine(Pos, End);

    std::stringstream Ctx;
    {
        size_t LineAbove = 0;
        while (LineAbove < NumLines && CtxStart > Start)
        {
            VERIFY_EXPR(IsNewLine(CtxStart[-1]));
            if (CtxStart[-1] == '\n' && CtxStart > Start + 1 && CtxStart[-2] == '\r')
                --CtxStart;
            if (CtxStart > Start)
                --CtxStart;
            while (CtxStart > Start && !IsNewLine(CtxStart[-1]))
                --CtxStart;
            ++LineAbove;
        }
        VERIFY_EXPR(CtxStart == Start || IsNewLine(CtxStart[-1]));
        Ctx.write(&*CtxStart, Pos - CtxStart);
    }

    Ctx << std::endl;
    for (size_t i = 0; i < CharPos; ++i)
        Ctx << ' ';
    Ctx << '^';

    if (Pos != End)
    {
        auto   CtxEnd    = Pos;
        size_t LineBelow = 0;
        while (LineBelow < NumLines && CtxEnd != End && *CtxEnd != '\0')
        {
            if (*CtxEnd == '\r' && CtxEnd + 1 != End && CtxEnd[+1] == '\n')
                ++CtxEnd;
            if (CtxEnd != End)
                ++CtxEnd;
            CtxEnd = SkipLine(CtxEnd, End);
            ++LineBelow;
        }
        Ctx.write(&*Pos, CtxEnd - Pos);
    }

    return Ctx.str();
}